

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_atomic_counters_limit
               (NegativeTestContext *ctx)

{
  RenderContext *renderCtx;
  ostream *poVar1;
  long lVar2;
  ShaderProgram program;
  ostringstream shaderBody;
  ostringstream shaderDecl;
  string local_538;
  string local_518;
  string local_4f8;
  uint local_4d8;
  value_type local_4d0;
  undefined1 local_4b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0 [4];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_420;
  undefined1 local_400 [32];
  ShaderProgram local_3e0;
  ostringstream local_310 [112];
  ios_base local_2a0 [264];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__cxx11::ostringstream::ostringstream(local_310);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(binding = 0, offset = 0) uniform atomic_uint u_atomic0;\n"
             ,0x3f);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"layout(binding = 0, offset = ",0x1d);
  local_3e0.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8265,(GLint *)&local_3e0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,") uniform atomic_uint u_atomic1;\n",0x21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"layout(binding = 0) buffer Output {\n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    uint value;\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} sb_out;\n",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,"    uint oldVal = 0u;\n",0x16);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,"    oldVal = atomicCounterIncrement(u_atomic0);\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,"    oldVal = atomicCounterIncrement(u_atomic1);\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_310,"    sb_out.value = oldVal;\n",0x1b);
  renderCtx = ctx->m_renderCtx;
  local_400[0x10] = 0;
  local_400._17_8_ = 0;
  local_400._0_8_ = (pointer)0x0;
  local_400[8] = 0;
  local_400._9_7_ = 0;
  memset(local_4b0,0,0xac);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateComputeShader(&local_538,ctx,&local_4f8,&local_518);
  local_4d8 = 5;
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d0,local_538._M_dataplus._M_p,
             local_538._M_dataplus._M_p + local_538._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4b0 + (ulong)local_4d8 * 0x18),&local_4d0);
  glu::ShaderProgram::ShaderProgram(&local_3e0,renderCtx,(ProgramSources *)local_4b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_400);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_420);
  lVar2 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_4b0 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  local_4b0._0_8_ = local_4a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4b0,
             "Link error is generated if compute shader exceeds GL_MAX_COMPUTE_ATOMIC_COUNTERS.","")
  ;
  NegativeTestContext::beginSection(ctx,(string *)local_4b0);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b0._0_8_ !=
      local_4a0) {
    operator_delete((void *)local_4b0._0_8_,(ulong)(local_4a0[0]._M_dataplus._M_p + 1));
  }
  verifyLinkError(ctx,&local_3e0);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&local_3e0);
  std::__cxx11::ostringstream::~ostringstream(local_310);
  std::ios_base::~ios_base(local_2a0);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void exceed_atomic_counters_limit (NegativeTestContext& ctx)
{
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "layout(binding = 0, offset = 0) uniform atomic_uint u_atomic0;\n"
				<< "layout(binding = 0, offset = " << sizeof(GLuint) * getResourceLimit(ctx, GL_MAX_COMPUTE_ATOMIC_COUNTERS) << ") uniform atomic_uint u_atomic1;\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    uint value;\n"
				<< "} sb_out;\n";

	shaderBody	<< "    uint oldVal = 0u;\n"
				<< "    oldVal = atomicCounterIncrement(u_atomic0);\n"
				<< "    oldVal = atomicCounterIncrement(u_atomic1);\n"
				<< "    sb_out.value = oldVal;\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if compute shader exceeds GL_MAX_COMPUTE_ATOMIC_COUNTERS.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}